

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestInfo *pTVar3;
  InternalRunDeathTestFlag *pIVar4;
  _union_1457 _Var5;
  int iVar6;
  int iVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  pointer __s;
  int *piVar9;
  void *__addr;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  long lVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  long lVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  undefined8 uVar15;
  ulong uVar16;
  size_t __len;
  int pipe_fd [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  int death_test_index;
  ExecDeathTestArgs args_2;
  string internal_flag;
  sigaction saved_sigprof_action;
  string filter_flag;
  sigaction ignore_sigprof_action;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  string local_210;
  int local_1f0;
  int local_1ec;
  string local_1e8;
  int local_1c8 [2];
  string local_1c0;
  value_type local_1a0;
  _union_1457 local_180;
  size_type local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170 [8];
  value_type local_e8;
  _union_1457 local_c8;
  undefined1 local_c0 [8];
  size_type local_b8;
  ulong uStack_b0;
  
  UnitTest::GetInstance();
  pTVar3 = (UnitTest::GetInstance::instance.impl_)->current_test_info_;
  pIVar4 = ((UnitTest::GetInstance::instance.impl_)->internal_run_death_test_flag_)._M_t.
           super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>._M_head_impl
  ;
  local_1c8[0] = (pTVar3->result_).death_test_count_;
  if (pIVar4 != (InternalRunDeathTestFlag *)0x0) {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar4->write_fd_;
    return EXECUTE_TEST;
  }
  iVar6 = pipe(&local_1f0);
  if (iVar6 == -1) {
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"CHECK failed: File ","");
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_270,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/VgTajdd[P]plugin_manager/build_O3/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                       );
    local_2b0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar13 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p == paVar13) {
      local_2b0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_2b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    }
    else {
      local_2b0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    }
    local_2b0._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_2b0,", line ");
    local_2d0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar13 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p == paVar13) {
      local_2d0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_2d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    }
    local_2d0._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    local_250._M_dataplus._M_p._0_4_ = 0x555;
    StreamableToString<int>(&local_290,(int *)&local_250);
    std::operator+(&local_2f0,&local_2d0,&local_290);
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_2f0,": ");
    local_c8.sa_handler = (__sighandler_t)(pbVar8->_M_dataplus)._M_p;
    paVar13 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.sa_handler == paVar13) {
      local_b8 = paVar13->_M_allocated_capacity;
      uStack_b0 = *(ulong *)((long)&pbVar8->field_2 + 8);
      local_c8.sa_handler = (__sighandler_t)(local_c0 + 8);
    }
    else {
      local_b8 = paVar13->_M_allocated_capacity;
    }
    local_c0 = (undefined1  [8])pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_c8,"pipe(pipe_fd) != -1");
    local_180.sa_handler = (__sighandler_t)(pbVar8->_M_dataplus)._M_p;
    paVar13 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.sa_handler == paVar13) {
      local_170[0]._0_8_ = paVar13->_M_allocated_capacity;
      local_170[0]._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_180.sa_handler = (__sighandler_t)local_170;
    }
    else {
      local_170[0]._0_8_ = paVar13->_M_allocated_capacity;
    }
    local_178 = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    DeathTestAbort((string *)&local_180);
  }
  iVar6 = fcntl(local_1ec,2,0);
  if (iVar6 == -1) {
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"CHECK failed: File ","");
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_270,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/VgTajdd[P]plugin_manager/build_O3/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                       );
    local_2b0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar13 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p == paVar13) {
      local_2b0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_2b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    }
    else {
      local_2b0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    }
    local_2b0._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_2b0,", line ");
    local_2d0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar13 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p == paVar13) {
      local_2d0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_2d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    }
    local_2d0._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    local_250._M_dataplus._M_p._0_4_ = 0x558;
    StreamableToString<int>(&local_290,(int *)&local_250);
    std::operator+(&local_2f0,&local_2d0,&local_290);
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_2f0,": ");
    local_c8.sa_handler = (__sighandler_t)(pbVar8->_M_dataplus)._M_p;
    paVar13 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.sa_handler == paVar13) {
      local_b8 = paVar13->_M_allocated_capacity;
      uStack_b0 = *(ulong *)((long)&pbVar8->field_2 + 8);
      local_c8.sa_handler = (__sighandler_t)(local_c0 + 8);
    }
    else {
      local_b8 = paVar13->_M_allocated_capacity;
    }
    local_c0 = (undefined1  [8])pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_c8,"fcntl(pipe_fd[1], F_SETFD, 0) != -1");
    local_180.sa_handler = (__sighandler_t)(pbVar8->_M_dataplus)._M_p;
    paVar13 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.sa_handler == paVar13) {
      local_170[0]._0_8_ = paVar13->_M_allocated_capacity;
      local_170[0]._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_180.sa_handler = (__sighandler_t)local_170;
    }
    else {
      local_170[0]._0_8_ = paVar13->_M_allocated_capacity;
    }
    local_178 = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    DeathTestAbort((string *)&local_180);
  }
  paVar13 = &local_2b0.field_2;
  local_2b0._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"--","");
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_2b0,"gtest_");
  paVar2 = &local_2d0.field_2;
  local_2d0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p == paVar10) {
    local_2d0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_2d0._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_2d0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_2d0._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_2d0,"filter=");
  local_2f0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p == paVar10) {
    local_2f0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  }
  else {
    local_2f0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_2f0._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_2f0,(pTVar3->test_suite_name_)._M_dataplus._M_p);
  local_c8.sa_handler = (__sighandler_t)(pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.sa_handler == paVar10) {
    local_b8 = paVar10->_M_allocated_capacity;
    uStack_b0 = *(ulong *)((long)&pbVar8->field_2 + 8);
    local_c8.sa_handler = (__sighandler_t)(local_c0 + 8);
  }
  else {
    local_b8 = paVar10->_M_allocated_capacity;
  }
  local_c0 = (undefined1  [8])pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c8
                      ,".");
  local_180.sa_handler = (__sighandler_t)local_170;
  _Var5.sa_handler = (__sighandler_t)(pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var5.sa_handler == paVar10) {
    local_170[0]._0_8_ = paVar10->_M_allocated_capacity;
    local_170[0]._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_170[0]._0_8_ = paVar10->_M_allocated_capacity;
    local_180.sa_handler = _Var5.sa_handler;
  }
  local_178 = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_180,(pTVar3->name_)._M_dataplus._M_p);
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar11 = &pbVar8->field_2;
  if (paVar10 == paVar11) {
    local_e8.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_e8.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_e8.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_e8._M_dataplus._M_p = (pointer)paVar10;
  }
  local_e8._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.sa_handler != local_170) {
    operator_delete(local_180.sa_handler,local_170[0]._M_allocated_capacity + 1);
  }
  if (local_c8.sa_handler != (__sighandler_t)(local_c0 + 8)) {
    operator_delete(local_c8.sa_handler,local_b8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != paVar13) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"--","");
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_230,"gtest_");
  local_250._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p == paVar10) {
    local_250.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_250.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  }
  else {
    local_250.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_250._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_250,"internal_run_death_test=");
  local_290._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p == paVar10) {
    local_290.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_290.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  }
  else {
    local_290.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_290._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_290,this->file_);
  local_270._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p == paVar10) {
    local_270.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_270.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  }
  else {
    local_270.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_270._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_270,"|");
  local_2b0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p == paVar10) {
    local_2b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_2b0._M_dataplus._M_p = (pointer)paVar13;
  }
  else {
    local_2b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_2b0._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  StreamableToString<int>(&local_210,&this->line_);
  uVar15 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != paVar13) {
    uVar15 = local_2b0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar15 < local_210._M_string_length + local_2b0._M_string_length) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_210._M_dataplus._M_p._4_4_,local_210._M_dataplus._M_p._0_4_) !=
        &local_210.field_2) {
      uVar15 = local_210.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < local_210._M_string_length + local_2b0._M_string_length) goto LAB_0010d2b6;
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_210,0,0,local_2b0._M_dataplus._M_p,local_2b0._M_string_length);
  }
  else {
LAB_0010d2b6:
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_2b0,
                       (char *)CONCAT44(local_210._M_dataplus._M_p._4_4_,
                                        local_210._M_dataplus._M_p._0_4_),local_210._M_string_length
                      );
  }
  local_2d0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p == paVar10) {
    local_2d0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_2d0._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_2d0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_2d0._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  paVar10->_M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_2d0,"|");
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar11 = &pbVar8->field_2;
  if (paVar10 == paVar11) {
    local_2f0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_2f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_2f0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_2f0._M_dataplus._M_p = (pointer)paVar10;
  }
  local_2f0._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  StreamableToString<int>(&local_1e8,local_1c8);
  uVar15 = (char *)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    uVar15 = local_2f0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar15 < (char *)(local_1e8._M_string_length + local_2f0._M_string_length)) {
    uVar15 = (char *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      uVar15 = local_1e8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < (char *)(local_1e8._M_string_length + local_2f0._M_string_length))
    goto LAB_0010d3d9;
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_1e8,0,0,local_2f0._M_dataplus._M_p,local_2f0._M_string_length);
  }
  else {
LAB_0010d3d9:
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_2f0,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  }
  local_c8.sa_handler = (__sighandler_t)(local_c0 + 8);
  _Var5.sa_handler = (__sighandler_t)(pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var5.sa_handler == paVar10) {
    local_b8 = paVar10->_M_allocated_capacity;
    uStack_b0 = *(ulong *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_b8 = paVar10->_M_allocated_capacity;
    local_c8.sa_handler = _Var5.sa_handler;
  }
  local_c0 = (undefined1  [8])pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  paVar10->_M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c8
                      ,"|");
  local_180.sa_handler = (__sighandler_t)local_170;
  _Var5.sa_handler = (__sighandler_t)(pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var5.sa_handler == paVar10) {
    local_170[0]._0_8_ = paVar10->_M_allocated_capacity;
    local_170[0]._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_170[0]._0_8_ = paVar10->_M_allocated_capacity;
    local_180.sa_handler = _Var5.sa_handler;
  }
  local_178 = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  StreamableToString<int>(&local_1c0,&local_1ec);
  uVar16 = CONCAT44(local_1c0._M_string_length._4_4_,(int)local_1c0._M_string_length) + local_178;
  uVar15 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.sa_handler != local_170) {
    uVar15 = local_170[0]._M_allocated_capacity;
  }
  if ((ulong)uVar15 < uVar16) {
    uVar15 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      uVar15 = local_1c0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < uVar16) goto LAB_0010d52d;
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_1c0,0,0,(char *)local_180.sa_handler,local_178);
  }
  else {
LAB_0010d52d:
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_180,local_1c0._M_dataplus._M_p,
                       CONCAT44(local_1c0._M_string_length._4_4_,(int)local_1c0._M_string_length));
  }
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar8->_M_dataplus)._M_p;
  paVar10 = &pbVar8->field_2;
  if (paVar11 == paVar10) {
    local_1a0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_1a0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_1a0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_1a0._M_dataplus._M_p = (pointer)paVar11;
  }
  local_1a0._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar8->_M_string_length = 0;
  paVar10->_M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.sa_handler != local_170) {
    operator_delete(local_180.sa_handler,local_170[0]._M_allocated_capacity + 1);
  }
  if (local_c8.sa_handler != (__sighandler_t)(local_c0 + 8)) {
    operator_delete(local_c8.sa_handler,local_b8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,(ulong)(local_1e8.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,(ulong)(local_2f0.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_210._M_dataplus._M_p._4_4_,local_210._M_dataplus._M_p._0_4_) !=
      &local_210.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_210._M_dataplus._M_p._4_4_,local_210._M_dataplus._M_p._0_4_),
                    local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != paVar13) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&g_argvs_abi_cxx11_;
  if (g_injected_test_argvs_abi_cxx11_ !=
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    __x = g_injected_test_argvs_abi_cxx11_;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_1e8,__x);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1e8,&local_e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1e8,&local_1a0);
  local_180.sa_handler = (__sighandler_t)local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &DeathTest::last_death_test_message__abi_cxx11_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.sa_handler != local_170) {
    operator_delete(local_180.sa_handler,local_170[0]._M_allocated_capacity + 1);
  }
  CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
  fflush((FILE *)0x0);
  lVar14 = (long)(local_1e8._M_string_length - (long)local_1e8._M_dataplus._M_p) >> 5;
  uVar16 = -(ulong)(lVar14 + 1U >> 0x3d != 0) | lVar14 * 8 + 8U;
  __s = (pointer)operator_new__(uVar16);
  memset(__s,0,uVar16);
  if ((pointer)local_1e8._M_string_length != local_1e8._M_dataplus._M_p) {
    lVar12 = 0;
    do {
      *(undefined8 *)(__s + lVar12 * 8) = *(undefined8 *)local_1e8._M_dataplus._M_p;
      lVar12 = lVar12 + 1;
      local_1e8._M_dataplus._M_p = local_1e8._M_dataplus._M_p + 0x20;
    } while (lVar14 + (ulong)(lVar14 == 0) != lVar12);
  }
  pcVar1 = __s + lVar14 * 8;
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  local_1c0._M_string_length._0_4_ = local_1f0;
  local_1c0._M_dataplus._M_p = __s;
  memset(&local_c8,0,0x98);
  sigemptyset((sigset_t *)local_c0);
  local_c8 = (_union_1457)0x1;
  while (iVar6 = sigaction(0x1b,(sigaction *)&local_c8,(sigaction *)&local_180), iVar6 == -1) {
    piVar9 = __errno_location();
    if (*piVar9 != 4) {
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"CHECK failed: File ","")
      ;
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_230,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/VgTajdd[P]plugin_manager/build_O3/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                     );
      local_250._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar13 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p == paVar13) {
        local_250.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_250.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      }
      else {
        local_250.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      }
      local_250._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_250,", line ");
      local_290._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar13 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p == paVar13) {
        local_290.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_290.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      }
      else {
        local_290.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      }
      local_290._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      local_1c8[1] = 0x513;
      StreamableToString<int>(&local_210,local_1c8 + 1);
      std::operator+(&local_270,&local_290,&local_210);
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_270,": ");
      local_2b0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar13 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p == paVar13) {
        local_2b0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_2b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      }
      else {
        local_2b0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      }
      local_2b0._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_2b0,"sigaction(SIGPROF, &ignore_sigprof_action, &saved_sigprof_action)"
                     );
      local_2d0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar13 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p == paVar13) {
        local_2d0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_2d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
      }
      else {
        local_2d0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      }
      local_2d0._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_2d0," != -1");
      local_2f0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar13 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p == paVar13) {
        local_2f0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_2f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      }
      else {
        local_2f0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      }
      local_2f0._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      DeathTestAbort(&local_2f0);
    }
  }
  if (FLAGS_gtest_death_test_use_fork == '\0') {
    if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') goto LAB_0010dfc7;
  }
  else {
    iVar6 = fork();
    if (iVar6 != 0) goto LAB_0010d9dd;
    ExecDeathTestChildMain(&local_1c0);
LAB_0010dfc7:
    AssumeRole();
  }
  iVar6 = getpagesize();
  __len = (size_t)(iVar6 * 2);
  __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
  if (__addr == (void *)0xffffffffffffffff) {
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"CHECK failed: File ","");
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_250,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/VgTajdd[P]plugin_manager/build_O3/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                       );
    local_290._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar13 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p == paVar13) {
      local_290.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_290.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    }
    else {
      local_290.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    }
    local_290._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_290,", line ");
    local_270._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar13 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p == paVar13) {
      local_270.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_270.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    }
    else {
      local_270.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    }
    local_270._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    local_210._M_dataplus._M_p._0_4_ = 0x51f;
    StreamableToString<int>(&local_230,(int *)&local_210);
    std::operator+(&local_2b0,&local_270,&local_230);
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_2b0,": ");
    local_2d0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar13 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p == paVar13) {
      local_2d0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_2d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    }
    local_2d0._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_2d0,"stack != MAP_FAILED");
    local_2f0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar13 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p == paVar13) {
      local_2f0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_2f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    }
    else {
      local_2f0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    }
    local_2f0._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    DeathTestAbort(&local_2f0);
  }
  lVar14 = 0;
  if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != '\0') {
    lVar14 = __len - 0x40;
  }
  if (((uint)(iVar6 * 2) < 0x41) || (((ulong)(lVar14 + (long)__addr) & 0x3f) != 0)) {
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"CHECK failed: File ","");
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_250,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/VgTajdd[P]plugin_manager/build_O3/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                       );
    local_290._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar13 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p == paVar13) {
      local_290.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_290.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    }
    else {
      local_290.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    }
    local_290._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_290,", line ");
    local_270._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar13 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p == paVar13) {
      local_270.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_270.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    }
    else {
      local_270.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    }
    local_270._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    local_210._M_dataplus._M_p._0_4_ = 0x52d;
    StreamableToString<int>(&local_230,(int *)&local_210);
    std::operator+(&local_2b0,&local_270,&local_230);
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_2b0,": ");
    local_2d0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar13 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p == paVar13) {
      local_2d0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_2d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    }
    local_2d0._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_2d0,
                        "static_cast<size_t>(stack_size) > kMaxStackAlignment && reinterpret_cast<uintptr_t>(stack_top) % kMaxStackAlignment == 0"
                       );
    local_2f0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar13 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p == paVar13) {
      local_2f0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_2f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    }
    else {
      local_2f0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    }
    local_2f0._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    DeathTestAbort(&local_2f0);
  }
  iVar6 = clone(ExecDeathTestChildMain,(void *)(lVar14 + (long)__addr),0x11,&local_1c0);
  iVar7 = munmap(__addr,__len);
  if (iVar7 == -1) {
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"CHECK failed: File ","");
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_250,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/VgTajdd[P]plugin_manager/build_O3/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                       );
    local_290._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar13 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p == paVar13) {
      local_290.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_290.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    }
    else {
      local_290.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    }
    local_290._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_290,", line ");
    local_270._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar13 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p == paVar13) {
      local_270.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_270.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    }
    else {
      local_270.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    }
    local_270._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    local_210._M_dataplus._M_p._0_4_ = 0x531;
    StreamableToString<int>(&local_230,(int *)&local_210);
    std::operator+(&local_2b0,&local_270,&local_230);
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_2b0,": ");
    local_2d0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar13 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p == paVar13) {
      local_2d0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_2d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    }
    else {
      local_2d0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    }
    local_2d0._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_2d0,"munmap(stack, stack_size) != -1");
    local_2f0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar13 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p == paVar13) {
      local_2f0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_2f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    }
    else {
      local_2f0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    }
    local_2f0._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    DeathTestAbort(&local_2f0);
  }
LAB_0010d9dd:
  while (iVar7 = sigaction(0x1b,(sigaction *)&local_180,(sigaction *)0x0), iVar7 == -1) {
    piVar9 = __errno_location();
    if (*piVar9 != 4) {
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"CHECK failed: File ","")
      ;
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_230,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/VgTajdd[P]plugin_manager/build_O3/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                     );
      local_250._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar13 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p == paVar13) {
        local_250.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_250.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      }
      else {
        local_250.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      }
      local_250._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_250,", line ");
      local_290._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar13 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p == paVar13) {
        local_290.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_290.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      }
      else {
        local_290.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      }
      local_290._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      local_1c8[1] = 0x53d;
      StreamableToString<int>(&local_210,local_1c8 + 1);
      std::operator+(&local_270,&local_290,&local_210);
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_270,": ");
      local_2b0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar13 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p == paVar13) {
        local_2b0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_2b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      }
      else {
        local_2b0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      }
      local_2b0._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_2b0,"sigaction(SIGPROF, &saved_sigprof_action, nullptr)");
      local_2d0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar13 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p == paVar13) {
        local_2d0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_2d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
      }
      else {
        local_2d0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      }
      local_2d0._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_2d0," != -1");
      local_2f0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
      paVar13 = &pbVar8->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p == paVar13) {
        local_2f0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_2f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      }
      else {
        local_2f0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      }
      local_2f0._M_string_length = pbVar8->_M_string_length;
      (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
      pbVar8->_M_string_length = 0;
      (pbVar8->field_2)._M_local_buf[0] = '\0';
      DeathTestAbort(&local_2f0);
    }
  }
  if (iVar6 != -1) {
    do {
      iVar7 = close(local_1ec);
      if (iVar7 != -1) {
        *(int *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = iVar6;
        (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_1f0;
        (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
        operator_delete__(__s);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_1e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        return OVERSEE_TEST;
      }
      piVar9 = __errno_location();
    } while (*piVar9 == 4);
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"CHECK failed: File ","");
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_290,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/VgTajdd[P]plugin_manager/build_O3/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                       );
    local_270._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar13 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p == paVar13) {
      local_270.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_270.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    }
    else {
      local_270.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    }
    local_270._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_270,", line ");
    local_2b0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar13 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p == paVar13) {
      local_2b0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_2b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    }
    else {
      local_2b0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    }
    local_2b0._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    local_230._M_dataplus._M_p._0_4_ = 0x56f;
    StreamableToString<int>(&local_250,(int *)&local_230);
    std::operator+(&local_2d0,&local_2b0,&local_250);
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_2d0,": ");
    local_2f0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar13 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p == paVar13) {
      local_2f0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      local_2f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    }
    else {
      local_2f0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    }
    local_2f0._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_2f0,"close(pipe_fd[1])");
    local_c8.sa_handler = (__sighandler_t)(pbVar8->_M_dataplus)._M_p;
    paVar13 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.sa_handler == paVar13) {
      local_b8 = paVar13->_M_allocated_capacity;
      uStack_b0 = *(ulong *)((long)&pbVar8->field_2 + 8);
      local_c8.sa_handler = (__sighandler_t)(local_c0 + 8);
    }
    else {
      local_b8 = paVar13->_M_allocated_capacity;
    }
    local_c0 = (undefined1  [8])pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_c8," != -1");
    local_180.sa_handler = (__sighandler_t)(pbVar8->_M_dataplus)._M_p;
    paVar13 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.sa_handler == paVar13) {
      local_170[0]._0_8_ = paVar13->_M_allocated_capacity;
      local_170[0]._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_180.sa_handler = (__sighandler_t)local_170;
    }
    else {
      local_170[0]._0_8_ = paVar13->_M_allocated_capacity;
    }
    local_178 = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    DeathTestAbort((string *)&local_180);
  }
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"CHECK failed: File ","");
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_250,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/VgTajdd[P]plugin_manager/build_O3/_deps/googletest-src/googletest/src/gtest-death-test.cc"
                     );
  local_290._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar13 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p == paVar13) {
    local_290.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_290.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  }
  else {
    local_290.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
  }
  local_290._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_290,", line ");
  local_270._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar13 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p == paVar13) {
    local_270.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_270.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  }
  else {
    local_270.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
  }
  local_270._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  local_210._M_dataplus._M_p._0_4_ = 0x540;
  StreamableToString<int>(&local_230,(int *)&local_210);
  std::operator+(&local_2b0,&local_270,&local_230);
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_2b0,": ");
  local_2d0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar13 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p == paVar13) {
    local_2d0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_2d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  }
  else {
    local_2d0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
  }
  local_2d0._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_2d0,"child_pid != -1");
  local_2f0._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
  paVar13 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p == paVar13) {
    local_2f0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_2f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  }
  else {
    local_2f0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
  }
  local_2f0._M_string_length = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar13;
  pbVar8->_M_string_length = 0;
  (pbVar8->field_2)._M_local_buf[0] = '\0';
  DeathTestAbort(&local_2f0);
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != nullptr) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                  "filter=" + info->test_suite_name() + "." +
                                  info->name();
  const std::string internal_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                    "internal_run_death_test=" + file_ + "|" +
                                    StreamableToString(line_) + "|" +
                                    StreamableToString(death_test_index) + "|" +
                                    StreamableToString(pipe_fd[1]);
  std::vector<std::string> args = GetArgvsForDeathTestChildProcess();
  args.push_back(filter_flag);
  args.push_back(internal_flag);

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  std::unique_ptr<char*[]> argv = CreateArgvFromArgs(args);
  const pid_t child_pid = ExecDeathTestSpawnChild(argv.get(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}